

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall FileTest_Read_Test::TestBody(FileTest_Read_Test *this)

{
  undefined1 uVar1;
  size_t __nbytes;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  file f;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char **expected;
  file *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_20;
  char *local_c;
  
  expected = &local_c;
  open_file();
  __nbytes = strlen("Don\'t panic!");
  read_abi_cxx11_((int)&stack0xffffffffffffffc0,expected,__nbytes);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)in_stack_ffffffffffffffa0,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x115573);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,(char *)in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::Message::~Message((Message *)0x1155bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1155ff);
  fmt::v5::file::~file(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

TEST(FileTest, Read) {
  file f = open_file();
  EXPECT_READ(f, FILE_CONTENT);
}